

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractscrollarea.cpp
# Opt level: O0

void __thiscall
QAbstractScrollAreaPrivate::QAbstractScrollAreaPrivate(QAbstractScrollAreaPrivate *this)

{
  QFramePrivate *in_RDI;
  
  QFramePrivate::QFramePrivate(in_RDI);
  *(undefined ***)&in_RDI->super_QWidgetPrivate = &PTR__QAbstractScrollAreaPrivate_00d0b470;
  *(undefined8 *)&in_RDI[1].super_QWidgetPrivate.field_0x10 = 0;
  *(undefined8 *)&in_RDI[1].super_QWidgetPrivate.field_0x18 = 0;
  *(undefined4 *)&in_RDI[1].super_QWidgetPrivate.field_0x20 = 0;
  *(undefined4 *)&in_RDI[1].super_QWidgetPrivate.field_0x24 = 0;
  in_RDI[1].super_QWidgetPrivate.field_0x28 = 0;
  in_RDI[1].super_QWidgetPrivate.field_0x29 = 0;
  QSize::QSize((QSize *)in_RDI);
  *(undefined4 *)&in_RDI[1].super_QWidgetPrivate.field_0x34 = 0;
  *(undefined8 *)&in_RDI[1].super_QWidgetPrivate.field_0x38 = 0;
  *(undefined8 *)&in_RDI[1].super_QWidgetPrivate.field_0x40 = 0;
  QRect::QRect((QRect *)in_RDI);
  *(undefined4 *)&in_RDI[1].super_QWidgetPrivate.field_0x58 = 0;
  *(undefined4 *)&in_RDI[1].super_QWidgetPrivate.field_0x5c = 0;
  *(undefined4 *)&in_RDI[1].super_QWidgetPrivate.field_0x60 = 0;
  *(undefined4 *)&in_RDI[1].super_QWidgetPrivate.field_0x64 = 0;
  *(undefined4 *)&in_RDI[1].super_QWidgetPrivate.field_0x68 = 0;
  *(undefined4 *)&in_RDI[1].super_QWidgetPrivate.field_0x6c = 0;
  QPoint::QPoint((QPoint *)in_RDI);
  QScopedPointer<QObject,_QScopedPointerDeleter<QObject>_>::QScopedPointer
            ((QScopedPointer<QObject,_QScopedPointerDeleter<QObject>_> *)
             &in_RDI[1].super_QWidgetPrivate.extra,(QObject *)0x0);
  return;
}

Assistant:

QAbstractScrollAreaPrivate::QAbstractScrollAreaPrivate()
    :hbar(nullptr), vbar(nullptr), vbarpolicy(Qt::ScrollBarAsNeeded), hbarpolicy(Qt::ScrollBarAsNeeded),
     shownOnce(false), inResize(false), sizeAdjustPolicy(QAbstractScrollArea::AdjustIgnored),
     viewport(nullptr), cornerWidget(nullptr), left(0), top(0), right(0), bottom(0),
     xoffset(0), yoffset(0), viewportFilter(nullptr)
{
}